

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::ByteSizeLong
          (CodeGeneratorResponse_File *this)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  string *psVar3;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  CodeGeneratorResponse_File *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = CodeGeneratorResponse_File::unknown_fields(this);
    sStack_38 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar3 = name_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_insertion_point(this);
    if (bVar1) {
      psVar3 = insertion_point_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_content(this);
    if (bVar1) {
      psVar3 = content_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
  }
  iVar2 = internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t CodeGeneratorResponse_File::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string insertion_point = 2;
    if (has_insertion_point()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->insertion_point());
    }

    // optional string content = 15;
    if (has_content()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->content());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}